

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O2

distance_t metric_soft_distance_linear(uint hard_x,uint8_t *soft_y,size_t len)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = 0;
  for (uVar2 = 0; uVar2 < len; uVar2 = uVar2 + 1) {
    uVar3 = hard_x & 1;
    hard_x = hard_x >> 1;
    iVar5 = (uint)soft_y[uVar2] + (-uVar3 & 0xffffff01);
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    iVar1 = iVar1 + iVar4;
  }
  return (distance_t)iVar1;
}

Assistant:

static inline distance_t metric_soft_distance_linear(unsigned int hard_x, const uint8_t *soft_y, size_t len) {
    distance_t dist = 0;
    for (unsigned int i = 0; i < len; i++) {
        unsigned int soft_x = ((int8_t)(0) - (hard_x & 1)) & 0xff;
        hard_x >>= 1;
        int d = soft_y[i] - soft_x;
        dist += (d < 0) ? -d : d;
    }
    return dist;
}